

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_data.hpp
# Opt level: O2

pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
* __thiscall
Disa::insert<double,unsigned_long,int>
          (pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
           *__return_storage_ptr__,Disa *this,CSR_Data<double,_unsigned_long> *data,int *row,
          int *column,double *value)

{
  int iVar1;
  long *plVar2;
  const_iterator __position;
  int *piVar3;
  int iVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var5;
  ostream *poVar6;
  source_location *location;
  long *plVar7;
  undefined8 uVar8;
  bool bVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  undefined **local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pair<std::tuple<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_bool>
  *local_48;
  value_type_conflict1 *local_40;
  int *local_38;
  
  iVar1 = *(int *)&(data->row_offset).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  location = (source_location *)(long)iVar1;
  if ((long)location < 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_70 = &PTR_s__workspace_llm4binary_github_lic_00155aa8;
    console_format_abi_cxx11_(&local_68,(Disa *)0x0,(Log_Level)&local_70,location);
    poVar6 = std::operator<<(poVar6,(string *)&local_68);
    poVar6 = std::operator<<(poVar6,"Row index must be positive.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    iVar4 = *row;
    if (-1 < iVar4) {
      lVar12 = *(long *)this;
      piVar10 = column;
      local_48 = __return_storage_ptr__;
      if ((*(long *)(this + 8) - lVar12 == 0) ||
         ((source_location *)((*(long *)(this + 8) - lVar12 >> 3) + -1) <= location)) {
        local_68._M_dataplus._M_p._0_4_ = iVar1 + 1;
        local_70 = (undefined **)CONCAT44(local_70._4_4_,*(undefined4 *)(this + 0x48));
        resize<double,unsigned_long,int>
                  ((CSR_Data<double,_unsigned_long> *)this,(int *)&local_68,(int *)&local_70);
        iVar4 = *row;
        lVar12 = *(long *)this;
      }
      local_40 = (value_type_conflict1 *)column;
      local_38 = row;
      if (*(ulong *)(this + 0x48) <= (ulong)(long)iVar4) {
        local_68._M_dataplus._M_p._0_4_ = 0;
        if (*(long *)(this + 8) != lVar12) {
          local_68._M_dataplus._M_p._0_4_ = (int)((ulong)(*(long *)(this + 8) - lVar12) >> 3) + -1;
        }
        local_70 = (undefined **)CONCAT44(local_70._4_4_,iVar4 + 1);
        resize<double,unsigned_long,int>
                  ((CSR_Data<double,_unsigned_long> *)this,(int *)&local_68,(int *)&local_70);
        lVar12 = *(long *)this;
      }
      piVar3 = local_38;
      lVar11 = (long)*(int *)&(data->row_offset).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start;
      uVar8 = lVar12 + lVar11 * 8;
      lower_bound<double,unsigned_long,int>((type *)&local_68,this,data,local_38,piVar10);
      if ((local_68.field_2._M_allocated_capacity == uVar8) &&
         (*(unsigned_long *)local_68._M_string_length == (long)*piVar3)) {
        _Var5._M_current =
             (double *)CONCAT44(local_68._M_dataplus._M_p._4_4_,(int)local_68._M_dataplus._M_p);
        bVar9 = false;
        uVar8 = local_68.field_2._M_allocated_capacity;
      }
      else {
        plVar2 = *(long **)(this + 8);
        plVar7 = (long *)(lVar12 + lVar11 * 8);
        while (plVar7 = plVar7 + 1, plVar7 < plVar2) {
          *plVar7 = *plVar7 + 1;
        }
        local_70 = (undefined **)(long)*piVar3;
        local_68._M_string_length =
             (size_type)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_insert_rval
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x18),
                        (const_iterator)local_68._M_string_length,(value_type_conflict *)&local_70);
        __position._M_current._4_4_ = local_68._M_dataplus._M_p._4_4_;
        __position._M_current._0_4_ = (int)local_68._M_dataplus._M_p;
        _Var5._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::insert
                       ((vector<double,_std::allocator<double>_> *)(this + 0x30),__position,local_40
                       );
        bVar9 = true;
      }
      (local_48->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<2UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
      ._M_head_impl._M_current = _Var5._M_current;
      (local_48->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<1UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
      ._M_head_impl._M_current = (unsigned_long *)local_68._M_string_length;
      (local_48->first).
      super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
      .
      super__Head_base<0UL,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
      ._M_head_impl._M_current = (unsigned_long *)uVar8;
      local_48->second = bVar9;
      return local_48;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_70 = &PTR_s__workspace_llm4binary_github_lic_00155ac0;
    console_format_abi_cxx11_(&local_68,(Disa *)0x0,(Log_Level)&local_70,location);
    poVar6 = std::operator<<(poVar6,(string *)&local_68);
    poVar6 = std::operator<<(poVar6,"Columns index must be positive.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&local_68);
  exit(1);
}

Assistant:

std::pair<typename CSR_Data<_value_type, _index_type>::iterator, bool> insert(CSR_Data<_value_type, _index_type>& data,
                                                                              const _arg_index_type& row,
                                                                              const _arg_index_type& column,
                                                                              const _value_type& value) {

  // Check sizes
  ASSERT_DEBUG(row >= 0, "Row index must be positive.");
  ASSERT_DEBUG(column >= 0, "Columns index must be positive.");

  // Resize if we need to.
  if(row >= size_row(data)) resize(data, row + 1, static_cast<_arg_index_type>(size_column(data)));
  if(column >= size_column(data)) resize(data, static_cast<_arg_index_type>(size_row(data)), column + 1);

  // Search for new insert
  const auto iter_row_start = data.row_offset.begin() + row;  // tricky, only create after resizing.
  auto [iter_row, iter_column, iter_value] = lower_bound(data, row, column);

  // Entry exists, return no insert.
  if(iter_row == iter_row_start && *iter_column == column)
    return {std::make_tuple(iter_row, iter_column, iter_value), false};

  // Insert new entry.
  for(auto non_zeros = iter_row_start + 1; non_zeros < data.row_offset.end(); ++(*non_zeros++)) {};  // increment and ++
  iter_column = data.i_column.insert(iter_column, column);
  iter_value = data.value.insert(iter_value, value);
  return {std::make_tuple(iter_row_start, iter_column, iter_value), true};
}